

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O2

void __thiscall JAMA::Eigenvalue<double>::tred2(Eigenvalue<double> *this)

{
  uint uVar1;
  uint uVar2;
  pointer pdVar3;
  double **ppdVar4;
  pointer pdVar5;
  double *pdVar6;
  int k;
  long lVar7;
  int j;
  ulong uVar8;
  ulong uVar9;
  int j_1;
  ulong uVar10;
  pointer pdVar11;
  pointer pdVar12;
  int k_2;
  double **ppdVar13;
  int j_2;
  long lVar14;
  int k_4;
  ulong uVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  uVar1 = this->n;
  lVar16 = (long)(int)uVar1;
  uVar15 = (ulong)(uVar1 - 1);
  pdVar3 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppdVar4 = (this->V).data_;
  uVar8 = 0;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
    pdVar3[uVar8] = ppdVar4[uVar15][uVar8];
  }
  while (1 < lVar16) {
    lVar14 = lVar16 + -1;
    pdVar3 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar21 = 0.0;
    for (lVar7 = 0; lVar7 < lVar14; lVar7 = lVar7 + 1) {
      dVar21 = dVar21 + ABS(pdVar3[lVar7]);
    }
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      dVar19 = 0.0;
      for (lVar7 = 0; lVar7 < lVar14; lVar7 = lVar7 + 1) {
        dVar17 = pdVar3[lVar7] / dVar21;
        pdVar3[lVar7] = dVar17;
        dVar19 = dVar19 + dVar17 * dVar17;
      }
      dVar17 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16 + -2];
      if (dVar19 < 0.0) {
        dVar18 = sqrt(dVar19);
      }
      else {
        dVar18 = SQRT(dVar19);
      }
      uVar8 = -(ulong)(-dVar17 < dVar17);
      dVar18 = (double)(~uVar8 & (ulong)dVar18 | (ulong)-dVar18 & uVar8);
      pdVar3 = (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3[lVar14] = dVar21 * dVar18;
      pdVar5 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5[lVar16 + -2] = dVar17 - dVar18;
      for (lVar7 = 0; lVar7 < lVar14; lVar7 = lVar7 + 1) {
        pdVar3[lVar7] = 0.0;
      }
      ppdVar4 = (this->V).data_;
      pdVar11 = pdVar5;
      pdVar12 = pdVar3;
      ppdVar13 = ppdVar4;
      uVar8 = uVar15;
      for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
        dVar21 = pdVar5[uVar10];
        pdVar6 = ppdVar4[uVar10];
        pdVar6[lVar14] = dVar21;
        dVar20 = pdVar6[uVar10] * dVar21 + pdVar3[uVar10];
        for (uVar9 = 1; uVar8 != uVar9; uVar9 = uVar9 + 1) {
          dVar20 = dVar20 + pdVar11[uVar9] * ppdVar13[uVar9][uVar10];
          pdVar12[uVar9] = ppdVar13[uVar9][uVar10] * dVar21 + pdVar12[uVar9];
        }
        pdVar3[uVar10] = dVar20;
        uVar8 = uVar8 - 1;
        ppdVar13 = ppdVar13 + 1;
        pdVar12 = pdVar12 + 1;
        pdVar11 = pdVar11 + 1;
      }
      dVar19 = -dVar17 * dVar18 + dVar19;
      dVar21 = 0.0;
      for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
        dVar17 = pdVar3[uVar8];
        pdVar3[uVar8] = dVar17 / dVar19;
        dVar21 = dVar21 + (dVar17 / dVar19) * pdVar5[uVar8];
      }
      for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
        pdVar3[uVar8] = pdVar5[uVar8] * (-dVar21 / (dVar19 + dVar19)) + pdVar3[uVar8];
      }
      ppdVar4 = (this->V).data_;
      for (uVar8 = 0; uVar8 != uVar15; uVar8 = uVar8 + 1) {
        dVar21 = pdVar5[uVar8];
        dVar17 = pdVar3[uVar8];
        ppdVar13 = (this->V).data_;
        for (uVar10 = uVar8; (long)uVar10 <= lVar16 + -2; uVar10 = uVar10 + 1) {
          pdVar6 = ppdVar13[uVar10];
          pdVar6[uVar8] = pdVar6[uVar8] - (pdVar3[uVar10] * dVar21 + pdVar5[uVar10] * dVar17);
        }
        pdVar5[uVar8] = ppdVar4[lVar16 + -2][uVar8];
        ppdVar4[lVar14][uVar8] = 0.0;
      }
    }
    else {
      (this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar14] = pdVar3[lVar16 + -2];
      ppdVar4 = (this->V).data_;
      for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
        pdVar3[uVar8] = ppdVar4[lVar16 + -2][uVar8];
        ppdVar4[lVar14][uVar8] = 0.0;
        ppdVar4[uVar8][lVar14] = 0.0;
      }
      dVar19 = 0.0;
    }
    (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar14] = dVar19;
    uVar15 = uVar15 - 1;
    lVar16 = lVar14;
  }
  uVar2 = this->n;
  uVar1 = uVar2 - 1;
  ppdVar4 = (this->V).data_;
  uVar10 = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar10;
  }
  pdVar3 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar16 = 1;
  while (uVar10 != uVar8) {
    pdVar6 = ppdVar4[uVar10];
    ppdVar4[uVar1][uVar10] = pdVar6[uVar10];
    pdVar6[uVar10] = 1.0;
    dVar21 = pdVar3[uVar10 + 1];
    uVar10 = uVar10 + 1;
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      for (lVar14 = 0; lVar16 != lVar14; lVar14 = lVar14 + 1) {
        pdVar3[lVar14] = ppdVar4[lVar14][uVar10] / dVar21;
      }
      for (lVar14 = 0; lVar14 != lVar16; lVar14 = lVar14 + 1) {
        dVar21 = 0.0;
        for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
          dVar21 = dVar21 + ppdVar4[lVar7][uVar10] * ppdVar4[lVar7][lVar14];
        }
        for (lVar7 = 0; lVar16 != lVar7; lVar7 = lVar7 + 1) {
          ppdVar4[lVar7][lVar14] = pdVar3[lVar7] * -dVar21 + ppdVar4[lVar7][lVar14];
        }
      }
    }
    for (lVar14 = 0; lVar16 != lVar14; lVar14 = lVar14 + 1) {
      ppdVar4[lVar14][uVar10] = 0.0;
    }
    lVar16 = lVar16 + 1;
  }
  pdVar3 = (this->d).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar10;
  }
  pdVar6 = (this->V).data_[uVar1];
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    pdVar3[uVar10] = pdVar6[uVar10];
    pdVar6[uVar10] = 0.0;
  }
  pdVar6[uVar1] = 1.0;
  *(this->e).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = 0.0;
  return;
}

Assistant:

void tred2() {
      //  This is derived from the Algol procedures tred2 by
      //  Bowdler, Martin, Reinsch, and Wilkinson, Handbook for
      //  Auto. Comp., Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutine in EISPACK.

      for (int j = 0; j < n; j++) {
        d(j) = V(n - 1, j);
      }

      // Householder reduction to tridiagonal form.

      for (int i = n - 1; i > 0; i--) {
        // Scale to avoid under/overflow.

        Real scale = 0.0;
        Real h     = 0.0;
        for (int k = 0; k < i; k++) {
          scale = scale + abs(d(k));
        }
        if (scale == 0.0) {
          e(i) = d(i - 1);
          for (int j = 0; j < i; j++) {
            d(j)    = V(i - 1, j);
            V(i, j) = 0.0;
            V(j, i) = 0.0;
          }
        } else {
          // Generate Householder vector.

          for (int k = 0; k < i; k++) {
            d(k) /= scale;
            h += d(k) * d(k);
          }
          Real f = d(i - 1);
          Real g = sqrt(h);
          if (f > 0) { g = -g; }
          e(i)     = scale * g;
          h        = h - f * g;
          d(i - 1) = f - g;
          for (int j = 0; j < i; j++) {
            e(j) = 0.0;
          }

          // Apply similarity transformation to remaining columns.

          for (int j = 0; j < i; j++) {
            f       = d(j);
            V(j, i) = f;
            g       = e(j) + V(j, j) * f;
            for (int k = j + 1; k <= i - 1; k++) {
              g += V(k, j) * d(k);
              e(k) += V(k, j) * f;
            }
            e(j) = g;
          }
          f = 0.0;
          for (int j = 0; j < i; j++) {
            e(j) /= h;
            f += e(j) * d(j);
          }
          Real hh = f / (h + h);
          for (int j = 0; j < i; j++) {
            e(j) -= hh * d(j);
          }
          for (int j = 0; j < i; j++) {
            f = d(j);
            g = e(j);
            for (int k = j; k <= i - 1; k++) {
              V(k, j) -= (f * e(k) + g * d(k));
            }
            d(j)    = V(i - 1, j);
            V(i, j) = 0.0;
          }
        }
        d(i) = h;
      }

      // Accumulate transformations.

      for (int i = 0; i < n - 1; i++) {
        V(n - 1, i) = V(i, i);
        V(i, i)     = 1.0;
        Real h      = d(i + 1);
        if (h != 0.0) {
          for (int k = 0; k <= i; k++) {
            d(k) = V(k, i + 1) / h;
          }
          for (int j = 0; j <= i; j++) {
            Real g = 0.0;
            for (int k = 0; k <= i; k++) {
              g += V(k, i + 1) * V(k, j);
            }
            for (int k = 0; k <= i; k++) {
              V(k, j) -= g * d(k);
            }
          }
        }
        for (int k = 0; k <= i; k++) {
          V(k, i + 1) = 0.0;
        }
      }
      for (int j = 0; j < n; j++) {
        d(j)        = V(n - 1, j);
        V(n - 1, j) = 0.0;
      }
      V(n - 1, n - 1) = 1.0;
      e(0)            = 0.0;
    }